

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

_Bool sysbvm_type_isDirectSubtypeOf(sysbvm_tuple_t type,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  sysbvm_tuple_t supertype_local;
  sysbvm_tuple_t type_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(supertype);
  if (((_Var1) && (_Var1 = sysbvm_tuple_isNonNullPointer(type), _Var1)) &&
     (_Var1 = sysbvm_tuple_isDummyValue(type), supertype_local = type, !_Var1)) {
    for (; supertype_local != 0; supertype_local = *(sysbvm_tuple_t *)(supertype_local + 0x30)) {
      if (supertype_local == supertype) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

SYSBVM_INLINE bool sysbvm_type_isDirectSubtypeOf(sysbvm_tuple_t type, sysbvm_tuple_t supertype)
{
    if(!sysbvm_tuple_isNonNullPointer(supertype)) return false;
    if(!sysbvm_tuple_isNonNullPointer(type)) return false;
    if(sysbvm_tuple_isDummyValue(type)) return false;

    while(type)
    {
        if(type == supertype)
            return true;

        type = ((sysbvm_type_tuple_t *)type)->supertype;
    }

    return false;
}